

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.h
# Opt level: O2

void enc_setup_mi(CommonModeInfoParams *mi_params)

{
  size_t __n;
  
  __n = ((long)mi_params->mi_rows + 0x1fU & 0xffffffffffffffe0) * (long)mi_params->mi_stride;
  memset(mi_params->mi_alloc,0,(long)mi_params->mi_alloc_size * 0xb0);
  memset(mi_params->mi_grid_base,0,__n * 8);
  memset(mi_params->tx_type_map,0,__n);
  return;
}

Assistant:

static inline void enc_setup_mi(CommonModeInfoParams *mi_params) {
  const int mi_grid_size =
      mi_params->mi_stride * calc_mi_size(mi_params->mi_rows);
  memset(mi_params->mi_alloc, 0,
         mi_params->mi_alloc_size * sizeof(*mi_params->mi_alloc));
  memset(mi_params->mi_grid_base, 0,
         mi_grid_size * sizeof(*mi_params->mi_grid_base));
  memset(mi_params->tx_type_map, 0,
         mi_grid_size * sizeof(*mi_params->tx_type_map));
}